

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall google::protobuf::ArenaTest_Alignment_Test::TestBody(ArenaTest_Alignment_Test *this)

{
  char *v;
  Nullable<const_char_*> failure_msg;
  LogMessage *pLVar1;
  size_t num_elements;
  Arena arena;
  uint local_ec;
  LogMessage local_e8;
  ThreadSafeArena local_d8;
  
  internal::ThreadSafeArena::ThreadSafeArena(&local_d8);
  num_elements = 0;
  while( true ) {
    if (num_elements == 200) {
      internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
      return;
    }
    v = Arena::CreateArray<char>((Arena *)&local_d8,num_elements);
    local_e8._0_8_ = ZEXT48((uint)v & 7);
    local_ec = 0;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                            ((unsigned_long *)&local_e8,&local_ec,
                             "reinterpret_cast<uintptr_t>(p) % 8 == 0u");
    if (failure_msg != (Nullable<const_char_*>)0x0) break;
    num_elements = num_elements + 1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
             ,0x6cd,failure_msg);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_e8,(int)num_elements);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0x10f1c82);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e8);
}

Assistant:

TEST(ArenaTest, Alignment) {
  Arena arena;
  for (int i = 0; i < 200; i++) {
    void* p = Arena::CreateArray<char>(&arena, i);
    ABSL_CHECK_EQ(reinterpret_cast<uintptr_t>(p) % 8, 0u) << i << ": " << p;
  }
}